

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void google::protobuf::compiler::js::anon_unknown_0::DepthFirstSearch
               (FileDescriptor *file,
               vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               *list,set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     *seen)

{
  int iVar1;
  FileDescriptor *file_00;
  pair<std::_Rb_tree_const_iterator<const_google::protobuf::FileDescriptor_*>,_bool> pVar2;
  int local_44;
  int i;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *seen_local;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *list_local;
  FileDescriptor *file_local;
  
  list_local = (vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *)file;
  pVar2 = std::
          set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ::insert(seen,(value_type *)&list_local);
  if (((pVar2.second ^ 0xffU) & 1) == 0) {
    for (local_44 = 0; iVar1 = FileDescriptor::dependency_count((FileDescriptor *)list_local),
        local_44 < iVar1; local_44 = local_44 + 1) {
      file_00 = FileDescriptor::dependency((FileDescriptor *)list_local,local_44);
      DepthFirstSearch(file_00,list,seen);
    }
    std::
    vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::push_back(list,(value_type *)&list_local);
  }
  return;
}

Assistant:

void DepthFirstSearch(const FileDescriptor* file,
                      std::vector<const FileDescriptor*>* list,
                      std::set<const FileDescriptor*>* seen) {
  if (!seen->insert(file).second) {
    return;
  }

  // Add all dependencies.
  for (int i = 0; i < file->dependency_count(); i++) {
    DepthFirstSearch(file->dependency(i), list, seen);
  }

  // Add this file.
  list->push_back(file);
}